

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 LexExtractNowdoc(SyStream *pStream,SyToken *pToken)

{
  byte *pbVar1;
  sxi32 sVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint nSize;
  ulong uVar14;
  bool bVar15;
  
  pbVar10 = pStream->zText;
  pbVar1 = pStream->zEnd;
  bVar15 = pbVar10 < pbVar1;
  if (bVar15) {
    bVar5 = *pbVar10;
    if (bVar5 < 0xc0) {
      ppuVar3 = __ctype_b_loc();
      pbVar10 = pbVar10 + 1;
      do {
        if ((bVar5 == 10) || (((*ppuVar3)[bVar5] & 0x2000) == 0)) break;
        bVar15 = pbVar10 < pbVar1;
        if (pbVar10 == pbVar1) {
          return -0x19;
        }
        bVar5 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (bVar5 < 0xc0);
      pbVar10 = pbVar10 + -1;
    }
    if (bVar15) {
      if ((*pbVar10 == 0x27) || (*pbVar10 == 0x22)) {
        pbVar10 = pbVar10 + 1;
      }
      uVar14 = (ulong)*pbVar10;
      pbVar9 = pbVar10;
      if (((0xbf < uVar14) || (ppuVar3 = __ctype_b_loc(), uVar14 == 0x5f)) ||
         (((*ppuVar3)[uVar14] & 8) != 0)) {
        do {
          pbVar8 = pbVar9;
          pbVar9 = pbVar8;
          if (pbVar8 < pbVar1) {
            lVar6 = (long)pbVar1 - (long)pbVar8;
            pbVar13 = pbVar8;
            pbVar11 = pbVar8;
            do {
              pbVar11 = pbVar11 + 1;
              bVar5 = *pbVar13;
              uVar14 = (ulong)bVar5;
              if ((0xbf < uVar14) ||
                 ((ppuVar3 = __ctype_b_loc(), uVar14 != 0x5f && (((*ppuVar3)[uVar14] & 8) == 0)))) {
                pbVar9 = pbVar13;
                if (0xbf < bVar5) {
                  pbVar9 = pbVar11;
                }
                break;
              }
              pbVar13 = pbVar13 + 1;
              lVar6 = lVar6 + -1;
              pbVar9 = pbVar1;
            } while (lVar6 != 0);
          }
        } while (pbVar9 != pbVar8);
        uVar14 = (long)pbVar8 - (long)pbVar10;
        if ((*pbVar8 == 0x27) || (*pbVar8 == 0x22)) {
          pbVar8 = pbVar8 + 1;
        }
        bVar15 = pbVar8 < pbVar1;
        if ((bVar15) && (bVar5 = *pbVar8, bVar5 < 0xc0)) {
          ppuVar3 = __ctype_b_loc();
          pbVar9 = pbVar8 + 1;
          pbVar11 = pbVar1 + ~(ulong)pbVar8;
          do {
            if ((bVar5 == 10) || (((*ppuVar3)[bVar5] & 0x2000) == 0)) break;
            bVar15 = pbVar9 < pbVar1;
            pbVar8 = pbVar1;
            if (pbVar11 == (byte *)0x0) goto LAB_001253fb;
            bVar5 = *pbVar9;
            pbVar9 = pbVar9 + 1;
            pbVar11 = pbVar11 + -1;
          } while (bVar5 < 0xc0);
          pbVar8 = pbVar9 + -1;
        }
LAB_001253fb:
        nSize = (uint)uVar14;
        if (!(bool)(~bVar15 & 1U | nSize == 0)) {
          if (*pbVar8 != 10) {
            return -0x19;
          }
          pStream->nLine = pStream->nLine + 1;
          pbVar13 = pbVar8 + 1;
          bVar15 = pbVar13 < pbVar1;
          pbVar11 = pbVar1;
          pbVar9 = pbVar13;
          if (bVar15) {
            uVar14 = uVar14 & 0xffffffff;
            pbVar4 = pbVar13;
            do {
              bVar5 = *pbVar4;
              pbVar12 = pbVar4;
              while (bVar5 != 10) {
                pbVar12 = pbVar12 + 1;
                bVar15 = pbVar12 < pbVar1;
                pbVar11 = pbVar1;
                pbVar9 = pbVar12;
                if (!bVar15) goto LAB_001255ce;
                bVar5 = *pbVar12;
              }
              pbVar11 = pbVar1;
              pbVar9 = pbVar12;
              if (!bVar15) break;
              pStream->nLine = pStream->nLine + 1;
              pbVar9 = pbVar12 + 1;
              pbVar4 = pbVar9;
              if ((nSize <= (uint)((int)pbVar1 - (int)pbVar9)) &&
                 (sVar2 = SyMemcmp(pbVar10,pbVar9,nSize), sVar2 == 0)) {
                pbVar11 = pbVar9 + uVar14;
                bVar15 = pbVar11 < pbVar1;
                if (!bVar15) break;
                bVar5 = *pbVar11;
                if (bVar5 < 0xc0) {
                  ppuVar3 = __ctype_b_loc();
                  pbVar12 = pbVar12 + uVar14 + 2;
                  do {
                    if ((bVar5 == 10) || (((*ppuVar3)[bVar5] & 0x2000) == 0)) break;
                    bVar15 = pbVar12 < pbVar1;
                    pbVar11 = pbVar1;
                    if (!bVar15) goto LAB_001255ce;
                    bVar5 = *pbVar12;
                    pbVar12 = pbVar12 + 1;
                  } while (bVar5 < 0xc0);
                  pbVar11 = pbVar12 + -1;
                }
                if (!bVar15) break;
                bVar5 = *pbVar11;
                pbVar4 = pbVar11;
                if (bVar5 == 0x3b) {
                  do {
                    pbVar4 = pbVar4 + 1;
                    if (pbVar1 <= pbVar4) goto LAB_001255ce;
                    uVar7 = (ulong)*pbVar4;
                  } while (((uVar7 < 0xc0) && (ppuVar3 = __ctype_b_loc(), uVar7 != 10)) &&
                          (((*ppuVar3)[uVar7] & 0x2000) != 0));
                  if (pbVar1 <= pbVar4) break;
                  bVar5 = *pbVar4;
                }
                if (bVar5 == 10) break;
              }
              bVar15 = pbVar4 < pbVar1;
              pbVar11 = pbVar1;
              pbVar9 = pbVar4;
            } while (bVar15);
          }
LAB_001255ce:
          pStream->zText = pbVar11;
          pToken->nType = 0x10000;
          (pToken->sData).zString = (char *)pbVar13;
          uVar14 = (ulong)(uint)((int)pbVar9 - (int)pbVar13);
          while( true ) {
            (pToken->sData).nByte = (uint)uVar14;
            if (uVar14 == 0) {
              return 0;
            }
            bVar5 = pbVar8[uVar14];
            if (0xffffffffffffffbf < (ulong)(long)(char)bVar5) break;
            ppuVar3 = __ctype_b_loc();
            uVar14 = uVar14 - 1;
            if ((*(byte *)((long)*ppuVar3 + (long)(char)bVar5 * 2 + 1) & 0x20) == 0) {
              return 0;
            }
          }
          return 0;
        }
      }
    }
  }
  return -0x19;
}

Assistant:

static sxi32 LexExtractNowdoc(SyStream *pStream, SyToken *pToken)
{
	const unsigned char *zIn  = pStream->zText;
	const unsigned char *zEnd = pStream->zEnd;
	const unsigned char *zPtr;
	SyString sDelim;
	SyString sStr;
	/* Jump leading white spaces */
	while( zIn < zEnd && zIn[0] < 0xc0 && SyisSpace(zIn[0]) && zIn[0] != '\n' ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* A simple symbol, return immediately */
		return SXERR_CONTINUE;
	}
	if( zIn[0] == '\'' || zIn[0] == '"' ){
		zIn++;
	}
	if( zIn[0] < 0xc0 && !SyisAlphaNum(zIn[0]) && zIn[0] != '_' ){
		/* Invalid delimiter, return immediately */
		return SXERR_CONTINUE;
	}
	/* Isolate the identifier */
	sDelim.zString = (const char *)zIn;
	for(;;){
		zPtr = zIn;
		/* Skip alphanumeric stream */
		while( zPtr < zEnd && zPtr[0] < 0xc0 && (SyisAlphaNum(zPtr[0]) || zPtr[0] == '_') ){
			zPtr++;
		}
		if( zPtr < zEnd && zPtr[0] >= 0xc0 ){
			zPtr++;
			/* UTF-8 stream */
			while( zPtr < zEnd && ((zPtr[0] & 0xc0) == 0x80) ){
				zPtr++;
			}
		}
		if( zPtr == zIn ){
			/* Not an UTF-8 or alphanumeric stream */
			break;
		}
		/* Synchronize pointers */
		zIn = zPtr;
	}
	/* Get the identifier length */
	sDelim.nByte = (sxu32)((const char *)zIn-sDelim.zString);
	if( zIn[0] == '"' || zIn[0] == '\'' ){
		/* Jump the trailing single quote */
		zIn++;
	}
	/* Jump trailing white spaces */
	while( zIn < zEnd && zIn[0] < 0xc0 && SyisSpace(zIn[0]) && zIn[0] != '\n' ){
		zIn++;
	}
	if( sDelim.nByte <= 0 || zIn >= zEnd || zIn[0] != '\n' ){
		/* Invalid syntax */
		return SXERR_CONTINUE;
	}
	pStream->nLine++; /* Increment line counter */
	zIn++;
	/* Isolate the delimited string */
	sStr.zString = (const char *)zIn;
	/* Go and found the closing delimiter */
	for(;;){
		/* Synchronize with the next line */
		while( zIn < zEnd && zIn[0] != '\n' ){
			zIn++;
		}
		if( zIn >= zEnd ){
			/* End of the input reached, break immediately */
			pStream->zText = pStream->zEnd;
			break;
		}
		pStream->nLine++; /* Increment line counter */
		zIn++;
		if( (sxu32)(zEnd - zIn) >= sDelim.nByte && SyMemcmp((const void *)sDelim.zString, (const void *)zIn, sDelim.nByte) == 0 ){
			zPtr = &zIn[sDelim.nByte];
			while( zPtr < zEnd && zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) && zPtr[0] != '\n' ){
				zPtr++;
			}
			if( zPtr >= zEnd ){
				/* End of input */
				pStream->zText = zPtr;
				break;
			}
			if( zPtr[0] == ';' ){
				const unsigned char *zCur = zPtr;
				zPtr++;
				while( zPtr < zEnd && zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) && zPtr[0] != '\n' ){
					zPtr++;
				}
				if( zPtr >= zEnd || zPtr[0] == '\n' ){
					/* Closing delimiter found, break immediately */
					pStream->zText = zCur; /* Keep the semi-colon */
					break;
				}
			}else if( zPtr[0] == '\n' ){
				/* Closing delimiter found, break immediately */
				pStream->zText = zPtr; /* Synchronize with the stream cursor */
				break;
			}
			/* Synchronize pointers and continue searching */
			zIn = zPtr;
		}
	} /* For(;;) */
	/* Get the delimited string length */
	sStr.nByte = (sxu32)((const char *)zIn-sStr.zString);
	/* Record token type and length */
	pToken->nType = JX9_TK_NOWDOC;
	SyStringDupPtr(&pToken->sData, &sStr);
	/* Remove trailing white spaces */
	SyStringRightTrim(&pToken->sData);
	/* All done */
	return SXRET_OK;
}